

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O2

coop_ref_t __thiscall
so_5::impl::coop_repository_details::deregistration_processor_t::ensure_root_coop_exists
          (deregistration_processor_t *this)

{
  iterator iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  coop_ref_t cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
                  *)(*in_RSI + 0x38),(key_type *)in_RSI[1]);
  if ((_Base_ptr)(*in_RSI + 0x40) == iVar1._M_node) {
    std::operator+(&local_38,"coop with name \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI[1]);
    std::operator+(&bStack_58,&local_38,"\' not found among registered cooperations");
    exception_t::raise(0x28381e);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2));
  cVar2.super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar2.super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (coop_ref_t)cVar2.super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

coop_ref_t
deregistration_processor_t::ensure_root_coop_exists() const
{
	// It is an error if the cooperation is not registered.
	auto it = m_core.m_registered_coop.find( m_root_coop_name );

	if( m_core.m_registered_coop.end() == it )
	{
		SO_5_THROW_EXCEPTION(
			rc_coop_has_not_found_among_registered_coop,
			"coop with name '" + m_root_coop_name +
			"' not found among registered cooperations" );
	}

	return it->second;
}